

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TarjanAnalysis.h
# Opt level: O0

void __thiscall
dg::llvmdg::legacy::TarjanAnalysis<dg::llvmdg::legacy::Block>::~TarjanAnalysis
          (TarjanAnalysis<dg::llvmdg::legacy::Block> *this)

{
  bool bVar1;
  reference ppSVar2;
  StronglyConnectedComponent *in_RDI;
  StronglyConnectedComponent *component;
  iterator __end0;
  iterator __begin0;
  set<dg::llvmdg::legacy::TarjanAnalysis<dg::llvmdg::legacy::Block>::StronglyConnectedComponent_*,_std::less<dg::llvmdg::legacy::TarjanAnalysis<dg::llvmdg::legacy::Block>::StronglyConnectedComponent_*>,_std::allocator<dg::llvmdg::legacy::TarjanAnalysis<dg::llvmdg::legacy::Block>::StronglyConnectedComponent_*>_>
  *__range3;
  set<dg::llvmdg::legacy::TarjanAnalysis<dg::llvmdg::legacy::Block>::StronglyConnectedComponent_*,_std::less<dg::llvmdg::legacy::TarjanAnalysis<dg::llvmdg::legacy::Block>::StronglyConnectedComponent_*>,_std::allocator<dg::llvmdg::legacy::TarjanAnalysis<dg::llvmdg::legacy::Block>::StronglyConnectedComponent_*>_>
  *in_stack_ffffffffffffffc8;
  StronglyConnectedComponent *pSVar3;
  _Self local_20;
  _Self local_18;
  pointer *local_10;
  
  local_10 = &in_RDI[1].nodes_.
              super__Vector_base<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_18._M_node =
       (_Base_ptr)
       std::
       set<dg::llvmdg::legacy::TarjanAnalysis<dg::llvmdg::legacy::Block>::StronglyConnectedComponent_*,_std::less<dg::llvmdg::legacy::TarjanAnalysis<dg::llvmdg::legacy::Block>::StronglyConnectedComponent_*>,_std::allocator<dg::llvmdg::legacy::TarjanAnalysis<dg::llvmdg::legacy::Block>::StronglyConnectedComponent_*>_>
       ::begin(in_stack_ffffffffffffffc8);
  local_20._M_node =
       (_Base_ptr)
       std::
       set<dg::llvmdg::legacy::TarjanAnalysis<dg::llvmdg::legacy::Block>::StronglyConnectedComponent_*,_std::less<dg::llvmdg::legacy::TarjanAnalysis<dg::llvmdg::legacy::Block>::StronglyConnectedComponent_*>,_std::allocator<dg::llvmdg::legacy::TarjanAnalysis<dg::llvmdg::legacy::Block>::StronglyConnectedComponent_*>_>
       ::end(in_stack_ffffffffffffffc8);
  while( true ) {
    bVar1 = std::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    ppSVar2 = std::
              _Rb_tree_const_iterator<dg::llvmdg::legacy::TarjanAnalysis<dg::llvmdg::legacy::Block>::StronglyConnectedComponent_*>
              ::operator*((_Rb_tree_const_iterator<dg::llvmdg::legacy::TarjanAnalysis<dg::llvmdg::legacy::Block>::StronglyConnectedComponent_*>
                           *)0x21e6cb);
    pSVar3 = *ppSVar2;
    if (pSVar3 != (StronglyConnectedComponent *)0x0) {
      StronglyConnectedComponent::~StronglyConnectedComponent(in_RDI);
      operator_delete(pSVar3,0x80);
    }
    std::
    _Rb_tree_const_iterator<dg::llvmdg::legacy::TarjanAnalysis<dg::llvmdg::legacy::Block>::StronglyConnectedComponent_*>
    ::operator++((_Rb_tree_const_iterator<dg::llvmdg::legacy::TarjanAnalysis<dg::llvmdg::legacy::Block>::StronglyConnectedComponent_*>
                  *)in_RDI);
  }
  std::
  set<dg::llvmdg::legacy::TarjanAnalysis<dg::llvmdg::legacy::Block>::StronglyConnectedComponent_*,_std::less<dg::llvmdg::legacy::TarjanAnalysis<dg::llvmdg::legacy::Block>::StronglyConnectedComponent_*>,_std::allocator<dg::llvmdg::legacy::TarjanAnalysis<dg::llvmdg::legacy::Block>::StronglyConnectedComponent_*>_>
  ::~set((set<dg::llvmdg::legacy::TarjanAnalysis<dg::llvmdg::legacy::Block>::StronglyConnectedComponent_*,_std::less<dg::llvmdg::legacy::TarjanAnalysis<dg::llvmdg::legacy::Block>::StronglyConnectedComponent_*>,_std::allocator<dg::llvmdg::legacy::TarjanAnalysis<dg::llvmdg::legacy::Block>::StronglyConnectedComponent_*>_>
          *)0x21e718);
  std::
  unordered_map<dg::llvmdg::legacy::Block_*,_dg::llvmdg::legacy::TarjanAnalysis<dg::llvmdg::legacy::Block>::Node,_std::hash<dg::llvmdg::legacy::Block_*>,_std::equal_to<dg::llvmdg::legacy::Block_*>,_std::allocator<std::pair<dg::llvmdg::legacy::Block_*const,_dg::llvmdg::legacy::TarjanAnalysis<dg::llvmdg::legacy::Block>::Node>_>_>
  ::~unordered_map((unordered_map<dg::llvmdg::legacy::Block_*,_dg::llvmdg::legacy::TarjanAnalysis<dg::llvmdg::legacy::Block>::Node,_std::hash<dg::llvmdg::legacy::Block_*>,_std::equal_to<dg::llvmdg::legacy::Block_*>,_std::allocator<std::pair<dg::llvmdg::legacy::Block_*const,_dg::llvmdg::legacy::TarjanAnalysis<dg::llvmdg::legacy::Block>::Node>_>_>
                    *)0x21e726);
  std::
  stack<dg::llvmdg::legacy::Block_*,_std::deque<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>_>
  ::~stack((stack<dg::llvmdg::legacy::Block_*,_std::deque<dg::llvmdg::legacy::Block_*,_std::allocator<dg::llvmdg::legacy::Block_*>_>_>
            *)0x21e734);
  return;
}

Assistant:

~TarjanAnalysis() {
        for (auto component : components_) {
            delete component;
        }
    }